

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  undefined1 *puVar1;
  long lVar2;
  char *pcVar3;
  CURLUcode CVar4;
  int iVar5;
  CURLU *u;
  long lVar6;
  size_t sVar7;
  curl_proxytype cVar8;
  CURLcode CVar9;
  proxy_info *ppVar10;
  char *scheme;
  char *proxypasswd;
  char *host;
  char *proxyuser;
  char *portptr;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  curl_proxytype local_48;
  curl_proxytype local_44;
  proxy_info *local_40;
  char *local_38;
  
  local_50 = (char *)0x0;
  local_60 = (char *)0x0;
  u = curl_url();
  local_68 = (char *)0x0;
  CVar4 = curl_url_set(u,CURLUPART_URL,proxy,0x208);
  if (CVar4 == CURLUE_OK) {
    CVar4 = curl_url_get(u,CURLUPART_SCHEME,&local_68,0);
    CVar9 = CURLE_OUT_OF_MEMORY;
    if (CVar4 == CURLUE_OK) {
      iVar5 = Curl_strcasecompare("https",local_68);
      cVar8 = CURLPROXY_HTTPS;
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare("socks5h",local_68);
        cVar8 = CURLPROXY_SOCKS5_HOSTNAME;
        if (iVar5 == 0) {
          iVar5 = Curl_strcasecompare("socks5",local_68);
          cVar8 = CURLPROXY_SOCKS5;
          if (iVar5 == 0) {
            iVar5 = Curl_strcasecompare("socks4a",local_68);
            cVar8 = CURLPROXY_SOCKS4A;
            if (iVar5 == 0) {
              iVar5 = Curl_strcasecompare("socks4",local_68);
              cVar8 = CURLPROXY_SOCKS4;
              if (iVar5 == 0) {
                iVar5 = Curl_strcasecompare("socks",local_68);
                cVar8 = CURLPROXY_SOCKS4;
                if (iVar5 == 0) {
                  iVar5 = Curl_strcasecompare("http",local_68);
                  cVar8 = proxytype;
                  if (iVar5 == 0) {
                    Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                    CVar9 = CURLE_COULDNT_CONNECT;
                    goto LAB_00498bb4;
                  }
                }
              }
            }
          }
        }
      }
      if ((cVar8 == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
        Curl_failf(data,
                   "Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
                   proxy);
        CVar9 = CURLE_NOT_BUILT_IN;
      }
      else {
        local_44 = cVar8 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
        local_40 = &conn->socks_proxy;
        ppVar10 = &conn->http_proxy;
        if (local_44 == CURLPROXY_SOCKS4) {
          ppVar10 = local_40;
        }
        ppVar10->proxytype = cVar8;
        local_48 = cVar8;
        curl_url_get(u,CURLUPART_USER,&local_50,0x40);
        curl_url_get(u,CURLUPART_PASSWORD,&local_60,0x40);
        if (local_60 != (char *)0x0 || local_50 != (char *)0x0) {
          (*Curl_cfree)(ppVar10->user);
          ppVar10->user = (char *)0x0;
          ppVar10->user = local_50;
          (*Curl_cfree)(ppVar10->passwd);
          ppVar10->passwd = (char *)0x0;
          if (local_60 == (char *)0x0) {
            local_60 = (*Curl_cstrdup)("");
            if (local_60 == (char *)0x0) goto LAB_00498bb4;
          }
          ppVar10->passwd = local_60;
          puVar1 = &(conn->bits).field_0x5;
          *puVar1 = *puVar1 | 1;
        }
        curl_url_get(u,CURLUPART_PORT,&local_38,0);
        if (local_38 == (char *)0x0) {
          lVar6 = 0x438;
          if (local_48 == CURLPROXY_HTTPS) {
            lVar6 = 0x1bb;
          }
          lVar2 = (data->set).proxyport;
          if (lVar2 != 0) {
            lVar6 = lVar2;
          }
        }
        else {
          lVar6 = strtol(local_38,(char **)0x0,10);
          (*Curl_cfree)(local_38);
        }
        if ((-1 < lVar6) &&
           (((ppVar10->port = lVar6, local_44 == CURLPROXY_SOCKS4 || (conn->port < 0)) ||
            ((local_40->host).rawalloc == (char *)0x0)))) {
          conn->port = lVar6;
        }
        CVar4 = curl_url_get(u,CURLUPART_HOST,&local_58,0x40);
        if (CVar4 == CURLUE_OK) {
          (*Curl_cfree)((ppVar10->host).rawalloc);
          pcVar3 = local_58;
          (ppVar10->host).rawalloc = (char *)0x0;
          (ppVar10->host).rawalloc = local_58;
          if (*local_58 == '[') {
            sVar7 = strlen(local_58);
            pcVar3[sVar7 - 1] = '\0';
            local_58 = local_58 + 1;
          }
          (ppVar10->host).name = local_58;
          CVar9 = CURLE_OK;
        }
      }
    }
  }
  else {
    Curl_failf(data,"Unsupported proxy syntax in \'%s\'",proxy);
    CVar9 = CURLE_COULDNT_RESOLVE_PROXY;
  }
LAB_00498bb4:
  (*Curl_cfree)(local_68);
  curl_url_cleanup(u);
  return CVar9;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
  }
  proxyinfo->host.name = host;

  error:
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}